

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

int32_t icu_63::anon_unknown_0::findSameBlock
                  (uint16_t *p,int32_t pStart,int32_t length,uint32_t *q,int32_t qStart,
                  int32_t blockLength)

{
  bool bVar1;
  int32_t blockLength_local;
  int32_t qStart_local;
  uint32_t *q_local;
  int32_t length_local;
  int32_t pStart_local;
  uint16_t *p_local;
  
  q_local._4_4_ = pStart;
  while( true ) {
    if (length - blockLength < q_local._4_4_) {
      return -1;
    }
    bVar1 = equalBlocks(p + q_local._4_4_,q + qStart,blockLength);
    if (bVar1) break;
    q_local._4_4_ = q_local._4_4_ + 1;
  }
  return q_local._4_4_;
}

Assistant:

int32_t findSameBlock(const uint16_t *p, int32_t pStart, int32_t length,
                      const uint32_t *q, int32_t qStart, int32_t blockLength) {
    // Ensure that we do not even partially get past length.
    length -= blockLength;

    q += qStart;
    while (pStart <= length) {
        if (equalBlocks(p + pStart, q, blockLength)) {
            return pStart;
        }
        ++pStart;
    }
    return -1;
}